

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OMultiplyAndAssign
          (_Type_CLASS_OBJECT *this,Variable *object_target,Variable *object_src)

{
  bool bVar1;
  Object *pOVar2;
  ClassObject *pCVar3;
  Type *this_00;
  State *state;
  uint *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable local_98;
  undefined1 local_88 [8];
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Callback *call;
  undefined1 local_38 [8];
  Variable v;
  Variable *object_src_local;
  Variable *object_target_local;
  _Type_CLASS_OBJECT *this_local;
  
  v.nb_ref = in_RCX;
  pOVar2 = Variable::operator->(object_src);
  pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
  Class::GetOperator((Class *)local_38,(OperatorType)pCVar3->ClassBase);
  pOVar2 = Variable::operator->((Variable *)local_38);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(object_src);
    pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
    if (pCVar3->ScriptState == (State *)0x0) {
      pOVar2 = Variable::operator->(object_src);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    }
    else {
      pOVar2 = Variable::operator->((Variable *)local_38);
      state = (State *)Object::GetData<LiteScript::Callback>(pOVar2);
      Nullable<LiteScript::Variable>::Nullable
                ((Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,object_src);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      Nullable<LiteScript::Variable>::~Nullable
                ((Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
      Variable::Variable(&local_98,(Variable *)v.nb_ref);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88,
                 &local_98);
      Variable::~Variable(&local_98);
      pOVar2 = Variable::operator->(object_src);
      pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
      Callback::operator()
                ((Callback *)this,state,
                 (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                 pCVar3->ScriptState);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
    }
  }
  else {
    pOVar2 = Variable::operator->(object_src);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  }
  Variable::~Variable((Variable *)local_38);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OMultiplyAndAssign(Variable& object_target, const Variable& object_src) const {
    Variable v = object_target->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_MUL_ASSIGN);
    if (v->GetType() == Type::CALLBACK) {
        if (object_target->GetData<ClassObject>().ScriptState == nullptr)
            return object_target->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object_target);
        std::vector<Variable> args;
        args.push_back(Variable(object_src));
        return call(*(object_target->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object_target->memory.Create(Type::NIL);
    }
}